

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

bool __thiscall ArgsManager::IsArgNegated(ArgsManager *this,string *strArg)

{
  int iVar1;
  long in_FS_OFFSET;
  bool bVar2;
  SettingsValue local_70;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetSetting(&local_70,this,strArg);
  if (local_70.typ == VBOOL) {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_70.val,"1");
    bVar2 = iVar1 != 0;
  }
  else {
    bVar2 = false;
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.val._M_dataplus._M_p != &local_70.val.field_2) {
    operator_delete(local_70.val._M_dataplus._M_p,local_70.val.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::IsArgNegated(const std::string& strArg) const
{
    return GetSetting(strArg).isFalse();
}